

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * whereTempTriggers(Parse *pParse,Table *pTab)

{
  sqlite3 *db_00;
  Schema *pSVar1;
  Trigger *pTVar2;
  char *zWhere;
  char *pcVar3;
  sqlite3 *db;
  
  db_00 = pParse->db;
  pSVar1 = db_00->aDb[1].pSchema;
  if (pTab->pSchema != pSVar1) {
    pTVar2 = sqlite3TriggerList(pParse,pTab);
    zWhere = (char *)0x0;
    for (; pTVar2 != (Trigger *)0x0; pTVar2 = pTVar2->pNext) {
      if (pTVar2->pSchema == pSVar1) {
        zWhere = whereOrName(db_00,zWhere,pTVar2->zName);
      }
    }
    if (zWhere != (char *)0x0) {
      pcVar3 = sqlite3MPrintf(pParse->db,"type=\'trigger\' AND (%s)",zWhere);
      sqlite3DbFree(pParse->db,zWhere);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

static char *whereTempTriggers(Parse *pParse, Table *pTab){
  Trigger *pTrig;
  char *zWhere = 0;
  const Schema *pTempSchema = pParse->db->aDb[1].pSchema; /* Temp db schema */

  /* If the table is not located in the temp-db (in which case NULL is 
  ** returned, loop through the tables list of triggers. For each trigger
  ** that is not part of the temp-db schema, add a clause to the WHERE 
  ** expression being built up in zWhere.
  */
  if( pTab->pSchema!=pTempSchema ){
    sqlite3 *db = pParse->db;
    for(pTrig=sqlite3TriggerList(pParse, pTab); pTrig; pTrig=pTrig->pNext){
      if( pTrig->pSchema==pTempSchema ){
        zWhere = whereOrName(db, zWhere, pTrig->zName);
      }
    }
  }
  if( zWhere ){
    char *zNew = sqlite3MPrintf(pParse->db, "type='trigger' AND (%s)", zWhere);
    sqlite3DbFree(pParse->db, zWhere);
    zWhere = zNew;
  }
  return zWhere;
}